

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O0

void lumeview::MessageQueue::dispatch(void)

{
  MessageReceiver *pMVar1;
  bool bVar2;
  MessageQueue *pMVar3;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *this;
  __shared_ptr_access<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  reference ppMVar5;
  MessageReceiver **receiver_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *__range1_1;
  MessageReceiver **receiver_1;
  iterator __end2;
  iterator __begin2;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *__range2;
  value_type *msg;
  queue<std::shared_ptr<const_lumeview::Message>,_std::deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>_>
  *messages;
  MessageReceiver **receiver;
  iterator __end1;
  iterator __begin1;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *__range1;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *receivers;
  
  pMVar3 = inst();
  this = &pMVar3->m_receivers;
  __end1 = std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::
           begin(this);
  receiver = (MessageReceiver **)
             std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
             ::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
                                *)&receiver);
    if (!bVar2) break;
    ppMVar5 = __gnu_cxx::
              __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
              ::operator*(&__end1);
    (*(*ppMVar5)->_vptr_MessageReceiver[2])();
    __gnu_cxx::
    __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
    ::operator++(&__end1);
  }
  pMVar3 = inst();
  while( true ) {
    bVar2 = std::
            queue<std::shared_ptr<const_lumeview::Message>,_std::deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>_>
            ::empty(&pMVar3->m_messages);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = (__shared_ptr_access<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 queue<std::shared_ptr<const_lumeview::Message>,_std::deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>_>
                 ::front(&pMVar3->m_messages);
    __end2 = std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
             ::begin(this);
    receiver_1 = (MessageReceiver **)
                 std::
                 vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::
                 end(this);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
                                  *)&receiver_1);
      if (!bVar2) break;
      ppMVar5 = __gnu_cxx::
                __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
                ::operator*(&__end2);
      pMVar1 = *ppMVar5;
      peVar4 = std::
               __shared_ptr_access<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(this_00);
      (*pMVar1->_vptr_MessageReceiver[4])(pMVar1,peVar4);
      __gnu_cxx::
      __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
      ::operator++(&__end2);
    }
    std::
    queue<std::shared_ptr<const_lumeview::Message>,_std::deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>_>
    ::pop(&pMVar3->m_messages);
  }
  __end1_1 = std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
             ::begin(this);
  receiver_2 = (MessageReceiver **)
               std::
               vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::
               end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
                        *)&receiver_2);
    if (!bVar2) break;
    ppMVar5 = __gnu_cxx::
              __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
              ::operator*(&__end1_1);
    (*(*ppMVar5)->_vptr_MessageReceiver[3])();
    __gnu_cxx::
    __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void MessageQueue::dispatch ()
{
	auto& receivers = inst().m_receivers;
	for(auto& receiver : receivers)
		receiver->message_dispatch_begins ();

	auto& messages = inst().m_messages;
	while (!messages.empty()) {
		auto& msg = messages.front();
		for(auto& receiver : receivers)
			receiver->receive_message (*msg);
		messages.pop();
	}

	for(auto& receiver : receivers)
		receiver->message_dispatch_ends ();
}